

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  TValue *r_local;
  TValue *l_local;
  lua_State *L_local;
  
  if (((l->tt_ & 0xf) == 3) && ((r->tt_ & 0xf) == 3)) {
    L_local._4_4_ = LEnum(l,r);
  }
  else {
    L_local._4_4_ = lessequalothers(L,l,r);
  }
  return L_local._4_4_;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else return lessequalothers(L, l, r);
}